

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int parse_record(ptls_t *tls,st_ptls_record_t *rec,uint8_t *src,size_t *len)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  ushort uVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong __n;
  uint8_t *puVar7;
  ulong delta;
  ulong uVar8;
  uint8_t *puVar9;
  
  puVar7 = (uint8_t *)*len;
  if (puVar7 == (uint8_t *)0x0) {
    __assert_fail("*len != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x13ba,
                  "int parse_record(ptls_t *, struct st_ptls_record_t *, const uint8_t *, size_t *)"
                 );
  }
  if ((tls->recvbuf).rec.base == (uint8_t *)0x0) {
    bVar2 = *src;
    if ((bVar2 & 0xfc) != 0x14) {
      return 0x32;
    }
    if ((uint8_t *)0x4 < puVar7) {
      rec->type = bVar2;
      rec->version = *(ushort *)(src + 1) << 8 | *(ushort *)(src + 1) >> 8;
      uVar4 = *(ushort *)(src + 3) << 8 | *(ushort *)(src + 3) >> 8;
      rec->length = (ulong)uVar4;
      if ((ushort)((bVar2 == 0x17 | 0x40) << 8) < uVar4) {
        return 0x32;
      }
      puVar9 = (uint8_t *)((ulong)uVar4 + 5);
      puVar7 = (uint8_t *)*len;
      if (puVar9 <= puVar7) {
        rec->fragment = src + 5;
        iVar5 = 0;
        goto LAB_0011b2a7;
      }
    }
  }
  buf = &tls->recvbuf;
  rec->type = '\0';
  rec->field_0x1 = 0;
  rec->version = 0;
  *(undefined4 *)&rec->field_0x4 = 0;
  rec->length = 0;
  rec->fragment = (uint8_t *)0x0;
  if ((buf->rec).base == (uint8_t *)0x0) {
    (tls->recvbuf).rec.base = "";
    (tls->recvbuf).rec.capacity = 0;
    (tls->recvbuf).rec.off = 0;
    (tls->recvbuf).rec.is_allocated = '\0';
    (tls->recvbuf).rec.align_bits = '\0';
    iVar5 = ptls_buffer_reserve_aligned(&buf->rec,5,'\0');
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  uVar8 = (tls->recvbuf).rec.off;
  puVar9 = src;
  puVar6 = puVar7;
  while (uVar8 < 5) {
    if (puVar6 == (uint8_t *)0x0) {
      return 0x202;
    }
    uVar1 = *puVar9;
    puVar9 = puVar9 + 1;
    puVar3 = (tls->recvbuf).rec.base;
    (tls->recvbuf).rec.off = uVar8 + 1;
    puVar3[uVar8] = uVar1;
    puVar6 = puVar6 + -1;
    uVar8 = (tls->recvbuf).rec.off;
  }
  puVar6 = (buf->rec).base;
  uVar1 = *puVar6;
  rec->type = uVar1;
  rec->version = *(ushort *)(puVar6 + 1) << 8 | *(ushort *)(puVar6 + 1) >> 8;
  uVar4 = *(ushort *)(puVar6 + 3) << 8 | *(ushort *)(puVar6 + 3) >> 8;
  rec->length = (ulong)uVar4;
  if ((ushort)((uVar1 == '\x17' | 0x40) << 8) < uVar4) {
    return 0x32;
  }
  delta = ((ulong)uVar4 + 5) - uVar8;
  if (delta != 0) {
    iVar5 = ptls_buffer_reserve_aligned(&buf->rec,delta,'\0');
    if (iVar5 != 0) {
      return iVar5;
    }
    __n = (long)(src + (long)puVar7) - (long)puVar9;
    if (delta < __n) {
      __n = delta;
    }
    uVar8 = (tls->recvbuf).rec.off;
    if (__n != 0) {
      memcpy((tls->recvbuf).rec.base + uVar8,puVar9,__n);
      puVar9 = puVar9 + __n;
      uVar8 = __n + (tls->recvbuf).rec.off;
      (tls->recvbuf).rec.off = uVar8;
    }
  }
  iVar5 = 0x202;
  if (uVar8 == rec->length + 5) {
    rec->fragment = (buf->rec).base + 5;
    iVar5 = 0;
  }
  puVar9 = puVar9 + (*len - (long)(src + (long)puVar7));
LAB_0011b2a7:
  *len = (size_t)puVar9;
  return iVar5;
}

Assistant:

static int parse_record(ptls_t *tls, struct st_ptls_record_t *rec, const uint8_t *src, size_t *len)
{
    int ret;

    assert(*len != 0);

    /* Check if the first byte is something that we can handle, otherwise do not bother parsing / buffering the entire record as it
     * is obviously broken. SSL 2.0 handshakes fall into this path as well. */
    if (tls->recvbuf.rec.base == NULL) {
        uint8_t type = src[0];
        switch (type) {
        case PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC:
        case PTLS_CONTENT_TYPE_ALERT:
        case PTLS_CONTENT_TYPE_HANDSHAKE:
        case PTLS_CONTENT_TYPE_APPDATA:
            break;
        default:
            return PTLS_ALERT_DECODE_ERROR;
        }
    }

    if (tls->recvbuf.rec.base == NULL && *len >= 5) {
        /* fast path */
        if ((ret = parse_record_header(rec, src)) != 0)
            return ret;
        if (5 + rec->length <= *len) {
            rec->fragment = src + 5;
            *len = rec->length + 5;
            return 0;
        }
    }

    /* slow path */
    const uint8_t *const end = src + *len;
    *rec = (struct st_ptls_record_t){0};

    if (tls->recvbuf.rec.base == NULL) {
        ptls_buffer_init(&tls->recvbuf.rec, "", 0);
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, 5)) != 0)
            return ret;
    }

    /* fill and parse the header */
    while (tls->recvbuf.rec.off < 5) {
        if (src == end)
            return PTLS_ERROR_IN_PROGRESS;
        tls->recvbuf.rec.base[tls->recvbuf.rec.off++] = *src++;
    }
    if ((ret = parse_record_header(rec, tls->recvbuf.rec.base)) != 0)
        return ret;

    /* fill the fragment */
    size_t addlen = rec->length + 5 - tls->recvbuf.rec.off;
    if (addlen != 0) {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, addlen)) != 0)
            return ret;
        if (addlen > (size_t)(end - src))
            addlen = end - src;
        if (addlen != 0) {
            memcpy(tls->recvbuf.rec.base + tls->recvbuf.rec.off, src, addlen);
            tls->recvbuf.rec.off += addlen;
            src += addlen;
        }
    }

    /* set rec->fragment if a complete record has been parsed */
    if (tls->recvbuf.rec.off == rec->length + 5) {
        rec->fragment = tls->recvbuf.rec.base + 5;
        ret = 0;
    } else {
        ret = PTLS_ERROR_IN_PROGRESS;
    }

    *len -= end - src;
    return ret;
}